

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O1

size_t mfwrite(void *ptr,size_t size,size_t nmemb,mFILE *mf)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  size_t __n;
  bool bVar4;
  
  if ((mf->mode & 2U) == 0) {
LAB_0012b011:
    nmemb = 0;
  }
  else {
    if ((mf->mode & 4U) != 0) {
      mf->offset = mf->size;
    }
    __n = size * nmemb;
    uVar3 = mf->alloced;
    sVar2 = mf->offset;
    if (uVar3 < sVar2 + __n) {
      do {
        bVar4 = uVar3 == 0;
        uVar3 = uVar3 * 2;
        if (bVar4) {
          uVar3 = 0x400;
        }
        pcVar1 = (char *)realloc(mf->data,uVar3);
        if (pcVar1 == (char *)0x0) goto LAB_0012b011;
        mf->alloced = uVar3;
        mf->data = pcVar1;
        sVar2 = mf->offset;
      } while (uVar3 < sVar2 + __n);
    }
    if (sVar2 < mf->flush_pos) {
      mf->flush_pos = sVar2;
    }
    memcpy(mf->data + sVar2,ptr,__n);
    uVar3 = __n + mf->offset;
    mf->offset = uVar3;
    if (mf->size < uVar3) {
      mf->size = uVar3;
    }
  }
  return nmemb;
}

Assistant:

size_t mfwrite(void *ptr, size_t size, size_t nmemb, mFILE *mf) {
    if (!(mf->mode & MF_WRITE))
	return 0;

    /* Append mode => forced all writes to end of file */
    if (mf->mode & MF_APPEND)
	mf->offset = mf->size;

    /* Make sure we have enough room */
    while (size * nmemb + mf->offset > mf->alloced) {
	size_t new_alloced = mf->alloced ? mf->alloced * 2 : 1024;
	void * new_data = realloc(mf->data, new_alloced);
	if (NULL == new_data) return 0;
	mf->alloced = new_alloced;
	mf->data    = new_data;
    }

    /* Record where we need to reflush from */
    if (mf->offset < mf->flush_pos)
	mf->flush_pos = mf->offset;

    /* Copy the data over */
    memcpy(&mf->data[mf->offset], ptr, size * nmemb);
    mf->offset += size * nmemb;
    if (mf->size < mf->offset)
	mf->size = mf->offset;

    return nmemb;
}